

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRunNegativeLink
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms)

{
  long lVar1;
  allocator<char> local_49;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  noUniforms;
  string local_30;
  
  noUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,fixed_sample_locations_values + 1,&local_49);
  lVar1 = doRun(this,&noUniforms,subroutineUniforms,&local_30,false,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&noUniforms);
  return lVar1;
}

Assistant:

long doRunNegativeLink(std::vector<SubroutineUniform>& subroutineUniforms)
	{
		std::vector<Uniform> noUniforms;
		return doRun(noUniforms, subroutineUniforms, "", false, true);
	}